

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_formats.c
# Opt level: O0

void CMformat_preload(CMConnection conn,CMFormat format)

{
  int iVar1;
  long in_RSI;
  long *in_RDI;
  int preload;
  int remote_FFSserver_ID;
  int my_FFSserver_ID;
  FMFormat *loaded_list;
  CMConnection in_stack_00000020;
  int load_count;
  size_t in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  uint uVar2;
  uint uVar3;
  long *local_20;
  int local_14;
  
  local_14 = 0;
  local_20 = (long *)in_RDI[6];
  iVar1 = (int)in_RDI[7];
  uVar3 = (uint)(*(int *)(*in_RDI + 0xb8) == -1);
  if (iVar1 == -1) {
    uVar3 = 1;
  }
  if (iVar1 == 0) {
    uVar3 = 1;
  }
  if (iVar1 != *(int *)(*in_RDI + 0xb8)) {
    uVar3 = 1;
  }
  if ((uVar3 != 0) && ((int)in_RDI[5] == 0)) {
    while( true ) {
      uVar2 = in_stack_ffffffffffffffd0 & 0xffffff;
      if (local_20 != (long *)0x0) {
        uVar2 = CONCAT13(*local_20 != 0,(int3)in_stack_ffffffffffffffd0);
      }
      if ((char)(uVar2 >> 0x18) == '\0') break;
      if (*local_20 == *(long *)(in_RSI + 0x10)) {
        return;
      }
      local_20 = local_20 + 1;
      local_14 = local_14 + 1;
      in_stack_ffffffffffffffd0 = uVar2;
    }
    preload_pbio_format(in_stack_00000020,(FMFormat)loaded_list);
    if (in_RDI[6] == 0) {
      local_20 = (long *)INT_CMmalloc(CONCAT44(uVar3,uVar2));
    }
    else {
      local_20 = (long *)INT_CMrealloc((void *)CONCAT44(uVar3,uVar2),in_stack_ffffffffffffffc8);
    }
    *(undefined8 *)((long)local_20 + (long)local_14 * 8) = *(undefined8 *)(in_RSI + 0x10);
    *(undefined8 *)((long)local_20 + (long)(local_14 + 1) * 8) = 0;
    in_RDI[6] = (long)local_20;
  }
  return;
}

Assistant:

extern void
CMformat_preload(CMConnection conn, CMFormat format)
{
    int load_count = 0;
    FMFormat *loaded_list = conn->preloaded_formats;
    int my_FFSserver_ID = conn->cm->FFSserver_identifier;
    int remote_FFSserver_ID = conn->remote_format_server_ID;
    int preload = 0;

    if (my_FFSserver_ID == -1) preload = 1;   /* we're self hosting formats */
    if (remote_FFSserver_ID == -1) preload = 1;   /* they're self hosting formats */
    if (remote_FFSserver_ID == 0) preload = 1; /* 0 is the unset state, we don't know their server, preload to be safe */
    if (remote_FFSserver_ID != my_FFSserver_ID) preload = 1;  /* if we're both using a format server, but not the same one, preload */

    if (preload == 0) return;

    if (conn->closed) return;

    /* if (CMtrace_on(conn->cm, CMFormatVerbose)) { */
    /* 	int junk; */
    /* 	fprintf(conn->cm->CMTrace_file, "Considering CMpbio Preload of format "); */
    /* 	fprint_server_ID(conn->cm->CMTrace_file, (unsigned char *)get_server_ID_FMformat(format->fmformat, &junk)); */
    /* 	fprintf(conn->cm->CMTrace_file, " value %p\n", format); */
    /* } */
    while (loaded_list && (*loaded_list != NULL)) {
      if (*loaded_list == format->fmformat) return;
	loaded_list++;
	load_count++;
    }
    
    preload_pbio_format(conn, format->fmformat);

    if (conn->preloaded_formats == NULL) {
	loaded_list = malloc(2*sizeof(*loaded_list));
    } else {
	loaded_list = realloc(conn->preloaded_formats, 
			      sizeof(*loaded_list) * (load_count + 2));
    }
    loaded_list[load_count] = format->fmformat;
    loaded_list[load_count+1] = NULL;
    conn->preloaded_formats = loaded_list;
}